

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void GetResidual(int width,int height,uint32_t *upper_row,uint32_t *current_row,uint8_t *max_diffs,
                int mode,int x_start,int x_end,int y,int max_quantization,int exact,
                int used_subtract_green,uint32_t *out)

{
  uint32_t a;
  uint32_t uVar1;
  uint32_t predict_00;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  int in_ESI;
  int in_EDI;
  uint32_t *in_R8;
  int in_R9D;
  uint32_t in_stack_00000008;
  uint32_t residual;
  uint32_t predict;
  int x;
  VP8LPredictorFunc pred_func;
  int in_stack_00000020;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  VP8LPredictorFunc p_Var2;
  
  if ((int)max_diffs == 0) {
    p_Var2 = VP8LPredictors[in_R9D];
    for (predict_00 = in_stack_00000008; (int)predict_00 < (int)predict; predict_00 = predict_00 + 1
        ) {
      if ((int)pred_func == 0) {
        if (predict_00 == 0) {
          in_stack_ffffffffffffffc0 = 0xff000000;
          a = in_stack_ffffffffffffffc0;
        }
        else {
          in_stack_ffffffffffffffc0 = in_RCX[(int)(predict_00 - 1)];
          a = in_stack_ffffffffffffffc0;
        }
      }
      else if (predict_00 == 0) {
        a = *in_RDX;
      }
      else {
        a = (*p_Var2)(in_RCX + (int)(predict_00 - 1),in_RDX + (int)predict_00);
      }
      if (((((in_stack_00000020 == 1) || (in_R9D == 0)) || ((int)pred_func == 0)) ||
          (((int)pred_func == in_ESI + -1 || (predict_00 == 0)))) || (predict_00 == in_EDI - 1U)) {
        in_stack_ffffffffffffffc4 = VP8LSubPixels(in_RCX[(int)predict_00],a);
      }
      else {
        in_stack_ffffffffffffffc4 =
             NearLossless((uint32_t)p_Var2,predict_00,a,in_stack_ffffffffffffffc4,
                          in_stack_ffffffffffffffc0);
        uVar1 = VP8LAddPixels(a,in_stack_ffffffffffffffc4);
        in_RCX[(int)predict_00] = uVar1;
      }
      if ((in_RCX[(int)predict_00] & 0xff000000) == 0) {
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xff000000;
        in_RCX[(int)predict_00] = a & 0xffffff;
        if ((predict_00 == 0) && ((int)pred_func != 0)) {
          in_RDX[in_EDI] = *in_RCX;
        }
      }
      upper_row[(int)(predict_00 - in_stack_00000008)] = in_stack_ffffffffffffffc4;
    }
  }
  else {
    PredictBatch((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (uint32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),upper_row
                 ,in_R8);
  }
  return;
}

Assistant:

static WEBP_INLINE void GetResidual(
    int width, int height, uint32_t* const upper_row,
    uint32_t* const current_row, const uint8_t* const max_diffs, int mode,
    int x_start, int x_end, int y, int max_quantization, int exact,
    int used_subtract_green, uint32_t* const out) {
  if (exact) {
    PredictBatch(mode, x_start, y, x_end - x_start, current_row, upper_row,
                 out);
  } else {
    const VP8LPredictorFunc pred_func = VP8LPredictors[mode];
    int x;
    for (x = x_start; x < x_end; ++x) {
      uint32_t predict;
      uint32_t residual;
      if (y == 0) {
        predict = (x == 0) ? ARGB_BLACK : current_row[x - 1];  // Left.
      } else if (x == 0) {
        predict = upper_row[x];  // Top.
      } else {
        predict = pred_func(&current_row[x - 1], upper_row + x);
      }
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization == 1 || mode == 0 || y == 0 || y == height - 1 ||
          x == 0 || x == width - 1) {
        residual = VP8LSubPixels(current_row[x], predict);
      } else {
        residual = NearLossless(current_row[x], predict, max_quantization,
                                max_diffs[x], used_subtract_green);
        // Update the source image.
        current_row[x] = VP8LAddPixels(predict, residual);
        // x is never 0 here so we do not need to update upper_row like below.
      }
#else
      (void)max_diffs;
      (void)height;
      (void)max_quantization;
      (void)used_subtract_green;
      residual = VP8LSubPixels(current_row[x], predict);
#endif
      if ((current_row[x] & kMaskAlpha) == 0) {
        // If alpha is 0, cleanup RGB. We can choose the RGB values of the
        // residual for best compression. The prediction of alpha itself can be
        // non-zero and must be kept though. We choose RGB of the residual to be
        // 0.
        residual &= kMaskAlpha;
        // Update the source image.
        current_row[x] = predict & ~kMaskAlpha;
        // The prediction for the rightmost pixel in a row uses the leftmost
        // pixel
        // in that row as its top-right context pixel. Hence if we change the
        // leftmost pixel of current_row, the corresponding change must be
        // applied
        // to upper_row as well where top-right context is being read from.
        if (x == 0 && y != 0) upper_row[width] = current_row[0];
      }
      out[x - x_start] = residual;
    }
  }
}